

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_1;
  ParenthesizedPropertyExprSyntax *pPVar1;
  DeepCloneVisitor visitor;
  Token local_48;
  Token local_38;
  SequenceMatchListSyntax *local_28;
  
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_1 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x28),(DeepCloneVisitor *)&local_48,
                      (BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x30) == (SyntaxNode *)0x0) {
    local_28 = (SequenceMatchListSyntax *)0x0;
  }
  else {
    local_28 = (SequenceMatchListSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x30),(DeepCloneVisitor *)&local_48,
                          (BumpAllocator *)__child_stack);
  }
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x38),(BumpAllocator *)__child_stack);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::ParenthesizedPropertyExprSyntax,slang::parsing::Token,slang::syntax::PropertyExprSyntax&,slang::syntax::SequenceMatchListSyntax*,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_38,(PropertyExprSyntax *)args_1,
                      &local_28,&local_48);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const ParenthesizedPropertyExprSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ParenthesizedPropertyExprSyntax>(
        node.openParen.deepClone(alloc),
        *deepClone<PropertyExprSyntax>(*node.expr, alloc),
        node.matchList ? deepClone(*node.matchList, alloc) : nullptr,
        node.closeParen.deepClone(alloc)
    );
}